

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParseHTML(TidyDocImpl *doc,Node *html,GetTokenMode mode)

{
  TidyTagId TVar1;
  int iVar2;
  Dict *pDVar3;
  TidyParserMemory *pTVar4;
  Node *pNVar5;
  Bool BVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  Node *pNVar10;
  long lVar11;
  Node **ppNVar12;
  uint uVar13;
  uint uVar14;
  undefined4 uVar15;
  Node *local_80;
  uint local_68;
  undefined8 local_58;
  undefined4 uStack_4c;
  
  uVar13 = 0;
  prvTidySetOptionBool(doc,TidyXmlTags,no);
  if (html == (Node *)0x0) {
    iVar2 = (doc->stack).top;
    lVar11 = (long)iVar2;
    if (lVar11 < 0) {
      uVar13 = 0;
      pNVar10 = (Node *)0x0;
      mode = IgnoreWhitespace;
      local_80 = (Node *)0x0;
    }
    else {
      pTVar4 = (doc->stack).content;
      local_80 = pTVar4[lVar11].original_node;
      pNVar10 = pTVar4[lVar11].reentry_node;
      mode = pTVar4[lVar11].reentry_mode;
      uVar13 = pTVar4[lVar11].reentry_state;
      (doc->stack).top = iVar2 + -1;
      if (uVar13 == 1) {
switchD_0013c65c_caseD_1:
        return (Node *)0x0;
      }
    }
  }
  else {
    pNVar10 = (Node *)0x0;
    local_80 = html;
  }
  pNVar9 = (Node *)0x0;
LAB_0013c61f:
  pNVar5 = (Node *)0x0;
switchD_0013c65c_caseD_5:
  uVar14 = uVar13;
  local_58 = pNVar5;
  pNVar7 = pNVar10;
  if ((uVar14 & 0xfffffffd) == 0) {
    pNVar7 = prvTidyGetToken(doc,IgnoreWhitespace);
  }
  uVar15 = (undefined4)((ulong)local_80 >> 0x20);
  pNVar5 = local_58;
  pNVar10 = pNVar7;
  uVar13 = 2;
  switch(uVar14) {
  case 0:
    if (pNVar7 != (Node *)0x0) {
      pDVar3 = pNVar7->tag;
      if ((pDVar3 != (Dict *)0x0) && (uVar13 = 4, pDVar3->id == TidyTag_HEAD))
      goto switchD_0013c65c_caseD_5;
      if (((local_80 != (Node *)0x0) && (pDVar3 == local_80->tag)) &&
         ((pNVar7->type == StartTag || (pNVar7->type == EndTag)))) {
        prvTidyReport(doc,local_80,pNVar7,0x235);
        prvTidyFreeNode(doc,pNVar7);
        uVar13 = 0;
        goto switchD_0013c65c_caseD_5;
      }
      BVar6 = InsertMisc(local_80,pNVar7);
      uVar13 = 0;
      if (BVar6 != no) goto switchD_0013c65c_caseD_5;
      prvTidyUngetToken(doc);
    }
    pNVar10 = prvTidyInferredTag(doc,TidyTag_HEAD);
    uVar13 = 4;
    goto switchD_0013c65c_caseD_5;
  default:
    goto switchD_0013c65c_caseD_1;
  case 2:
    goto switchD_0013c65c_caseD_2;
  case 3:
    pNVar7->parent = local_80;
    if (local_80 == (Node *)0x0) {
      pNVar7->prev = (Node *)0x0;
    }
    else {
      pNVar10 = local_80->last;
      pNVar7->prev = pNVar10;
      ppNVar12 = &pNVar10->next;
      if (pNVar10 == (Node *)0x0) {
        ppNVar12 = &local_80->content;
      }
      *ppNVar12 = pNVar7;
      local_80->last = pNVar7;
    }
    local_68 = 0;
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    uStack_4c = 1;
    goto LAB_0013ccd7;
  case 4:
    uStack_4c = 5;
    local_58 = pNVar7;
    break;
  case 5:
    goto switchD_0013c65c_caseD_5;
  case 6:
    prvTidypushMemory(doc,(TidyParserMemory)
                          ZEXT3648(CONCAT432(mode,CONCAT428(7,CONCAT424(mode,CONCAT420((int)((ulong)
                                                  local_58 >> 0x20),
                                                  CONCAT416((int)local_58,
                                                            CONCAT412(uVar15,CONCAT48((int)local_80,
                                                                                                                                                                            
                                                  prvTidyParseHTML)))))))));
    return pNVar9;
  case 7:
    pNVar5 = pNVar7;
    uVar13 = 2;
    goto switchD_0013c65c_caseD_5;
  case 8:
    uStack_4c = 9;
    break;
  case 9:
    pNVar8 = pNVar7->content;
    pNVar5 = pNVar7;
    pNVar10 = (Node *)0x0;
    uVar13 = 2;
    if (pNVar8 != (Node *)0x0) {
      do {
        if ((pNVar8->tag != (Dict *)0x0) && (pNVar8->tag->id == TidyTag_NOFRAMES)) {
          pNVar9 = pNVar8;
        }
        pNVar8 = pNVar8->next;
      } while (pNVar8 != (Node *)0x0);
      pNVar10 = (Node *)0x0;
      uVar13 = 2;
    }
    goto switchD_0013c65c_caseD_5;
  }
  pNVar7->parent = local_80;
  if (local_80 == (Node *)0x0) {
    pNVar7->prev = (Node *)0x0;
  }
  else {
    pNVar10 = local_80->last;
    pNVar7->prev = pNVar10;
    ppNVar12 = &pNVar10->next;
    if (pNVar10 == (Node *)0x0) {
      ppNVar12 = &local_80->content;
    }
    *ppNVar12 = pNVar7;
    local_80->last = pNVar7;
  }
  local_68 = 0x13c5cb;
LAB_0013ccd7:
  prvTidypushMemory(doc,(TidyParserMemory)
                        ZEXT3648(CONCAT432(mode,CONCAT428(uStack_4c,
                                                          CONCAT424(mode,CONCAT420(local_58._4_4_,
                                                                                   CONCAT416((
                                                  undefined4)local_58,
                                                  CONCAT412(uVar15,CONCAT48((int)local_80,
                                                                            (ulong)local_68)))))))))
  ;
  return pNVar7;
switchD_0013c65c_caseD_2:
  if (pNVar7 != (Node *)0x0) {
    if (pNVar7->tag == local_80->tag) {
      if (local_58 == (Node *)0x0 && pNVar7->type != StartTag) goto LAB_0013c95e;
LAB_0013c96d:
      prvTidyFreeNode(doc,pNVar7);
LAB_0013c978:
      uVar13 = 2;
      goto switchD_0013c65c_caseD_5;
    }
    BVar6 = InsertMisc(local_80,pNVar7);
    uVar13 = 2;
    if (BVar6 == no) {
      if (pNVar7->tag == (Dict *)0x0) {
LAB_0013c85e:
        BVar6 = prvTidynodeIsElement(pNVar7);
        if ((BVar6 == no) || (pDVar3 = pNVar7->tag, pDVar3 == (Dict *)0x0)) {
          prvTidyUngetToken(doc);
          if (local_58 == (Node *)0x0) {
LAB_0013ca65:
            pNVar10 = prvTidyInferredTag(doc,TidyTag_BODY);
            if (*(int *)((doc->config).value + 6) != 1) {
              prvTidyReport(doc,local_80,pNVar10,0x247);
            }
            prvTidyConstrainVersion(doc,0xfffffb6f);
            goto LAB_0013ca53;
          }
        }
        else {
          if ((pDVar3->model & 4) != 0) {
            MoveToHead(doc,local_80,pNVar7);
            goto LAB_0013c978;
          }
          if (local_58 == (Node *)0x0) {
            prvTidyUngetToken(doc);
            goto LAB_0013ca65;
          }
          if (pDVar3->id == TidyTag_FRAME) goto LAB_0013c95e;
          prvTidyUngetToken(doc);
        }
        if (pNVar9 == (Node *)0x0) {
          pNVar9 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
          pNVar9->parent = local_58;
          pNVar7 = local_58->last;
          pNVar9->prev = pNVar7;
          ppNVar12 = &pNVar7->next;
          if (pNVar7 == (Node *)0x0) {
            ppNVar12 = &local_58->content;
          }
          *ppNVar12 = pNVar9;
          local_58->last = pNVar9;
        }
        else {
          prvTidyReport(doc,local_80,pNVar7,0x267);
          if (pNVar9->type == StartEndTag) {
            pNVar9->type = StartTag;
          }
        }
        prvTidyConstrainVersion(doc,0x490);
      }
      else {
        TVar1 = pNVar7->tag->id;
        if (TVar1 == TidyTag_NOFRAMES) {
          if (pNVar7->type != StartTag) {
LAB_0013c95e:
            prvTidyReport(doc,local_80,pNVar7,0x235);
            goto LAB_0013c96d;
          }
          if (local_58 == (Node *)0x0) {
            prvTidyReport(doc,local_80,pNVar7,0x235);
            prvTidyFreeNode(doc,pNVar7);
            goto LAB_0013ca46;
          }
          if (pNVar9 != (Node *)0x0) goto LAB_0013c96d;
          pNVar7->parent = local_58;
          pNVar9 = local_58->last;
          pNVar7->prev = pNVar9;
          ppNVar12 = &pNVar9->next;
          if (pNVar9 == (Node *)0x0) {
            ppNVar12 = &local_58->content;
          }
          *ppNVar12 = pNVar7;
          local_58->last = pNVar7;
          pNVar9 = pNVar7;
          uVar13 = 6;
          goto switchD_0013c65c_caseD_5;
        }
        if (TVar1 == TidyTag_FRAMESET) {
          if (pNVar7->type != StartTag) goto LAB_0013c95e;
          pNVar5 = pNVar7;
          uVar13 = 8;
          if (local_58 != (Node *)0x0) {
            prvTidyReport(doc,local_80,pNVar7,0x237);
            pNVar5 = local_58;
          }
          goto switchD_0013c65c_caseD_5;
        }
        if (TVar1 != TidyTag_BODY) goto LAB_0013c85e;
        if (pNVar7->type != StartTag) goto LAB_0013c95e;
        if (((doc->config).value[1].v != 0) || (local_58 == (Node *)0x0)) {
          prvTidyConstrainVersion(doc,0xfffffb6f);
          uVar13 = 3;
          goto switchD_0013c65c_caseD_5;
        }
        prvTidyUngetToken(doc);
        if (pNVar9 != (Node *)0x0) {
          uVar13 = 6;
          if (pNVar9->type == StartEndTag) {
            pNVar9->type = StartTag;
          }
          goto switchD_0013c65c_caseD_5;
        }
        pNVar9 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
        pNVar9->parent = local_58;
        pNVar7 = local_58->last;
        pNVar9->prev = pNVar7;
        ppNVar12 = &pNVar7->next;
        if (pNVar7 == (Node *)0x0) {
          ppNVar12 = &local_58->content;
        }
        *ppNVar12 = pNVar9;
        local_58->last = pNVar9;
        prvTidyReport(doc,local_80,pNVar9,0x247);
      }
      uVar13 = 6;
    }
    goto switchD_0013c65c_caseD_5;
  }
  if (local_58 != (Node *)0x0) {
    return (Node *)0x0;
  }
LAB_0013ca46:
  pNVar10 = prvTidyInferredTag(doc,TidyTag_BODY);
LAB_0013ca53:
  uVar13 = 3;
  goto LAB_0013c61f;
}

Assistant:

Node* TY_(ParseHTML)( TidyDocImpl *doc, Node *html, GetTokenMode mode )
{
    Node *node = NULL;
    Node *head = NULL;
    Node *frameset = NULL;
    Node *noframes = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_COMPLETE,               /* Complete! */
        STATE_PRE_BODY,               /* In this state, we'll consider frames vs. body. */
        STATE_PARSE_BODY,             /* In this state, we can parse the body. */
        STATE_PARSE_HEAD,             /* In this state, we will setup head for parsing. */
        STATE_PARSE_HEAD_REENTER,     /* Resume here after parsing head. */
        STATE_PARSE_NOFRAMES,         /* In this state, we can parse noframes content. */
        STATE_PARSE_NOFRAMES_REENTER, /* In this state, we can restore more state. */
        STATE_PARSE_FRAMESET,         /* In this state, we will parse frameset content. */
        STATE_PARSE_FRAMESET_REENTER, /* We need to cleanup some things after parsing frameset. */
    } state = STATE_INITIAL;

    TY_(SetOptionBool)( doc, TidyXmlTags, no );

    if ( html == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node;
        DEBUG_LOG_REENTER_WITH_NODE(node);
        html = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.reentry_mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(html);
    }

    /*
     This main loop pulls tokens from the lexer until we're out of tokens,
     or until there's no more work to do.
     */
    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL || state == STATE_PRE_BODY )
        {
            node = TY_(GetToken)( doc, IgnoreWhitespace );
            DEBUG_LOG_GOT_TOKEN(node);
        }

        switch ( state )
        {
            /**************************************************************
             This case is all about finding a head tag and dealing with
             cases were we don't, so that we can move on to parsing a head
             tag.
             **************************************************************/
            case STATE_INITIAL:
            {
                /*
                 The only way we can possibly be here is if the lexer
                 had nothing to give us. Thus we'll create our own
                 head, and set the signal to start parsing it.
                 */
                if (node == NULL)
                {
                    node = TY_(InferredTag)(doc, TidyTag_HEAD);
                    state = STATE_PARSE_HEAD;
                    continue;
                }

                /* We found exactly what we expected: head. */
                if ( nodeIsHEAD(node) )
                {
                    state = STATE_PARSE_HEAD;
                    continue;
                }

                /* We did not expect to find an html closing tag here! */
                if (html && (node->tag == html->tag) && (node->type == EndTag))
                {
                    TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* Find and discard multiple <html> elements. */
                if (html && (node->tag == html->tag) && (node->type == StartTag))
                {
                    TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)(doc, node);
                    continue;
                }

                /* Deal with comments, etc. */
                if (InsertMisc(html, node))
                    continue;

                /*
                 At this point, we didn't find a head tag, so put the
                 token back and create our own head tag, so we can
                 move on.
                 */
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_HEAD);
                state = STATE_PARSE_HEAD;
                continue;
            } break;


            /**************************************************************
             This case determines whether we're dealing with body or
             frameset + noframes, and sets things up accordingly.
             **************************************************************/
            case STATE_PRE_BODY:
            {
                if (node == NULL )
                {
                    if (frameset == NULL) /* Implied body. */
                    {
                        node = TY_(InferredTag)(doc, TidyTag_BODY);
                        state = STATE_PARSE_BODY;
                    } else {
                        state = STATE_COMPLETE;
                    }

                    continue;
                }

                /* Robustly handle html tags. */
                if (node->tag == html->tag)
                {
                    if (node->type != StartTag && frameset == NULL)
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);

                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* Deal with comments, etc. */
                if (InsertMisc(html, node))
                    continue;

                /* If frameset document, coerce <body> to <noframes> */
                if ( nodeIsBODY(node) )
                {
                    if (node->type != StartTag)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
                    {
                        if (frameset != NULL)
                        {
                            TY_(UngetToken)( doc );

                            if (noframes == NULL)
                            {
                                noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                                TY_(InsertNodeAtEnd)(frameset, noframes);
                                TY_(Report)(doc, html, noframes, INSERTING_TAG);
                            }
                            else
                            {
                                if (noframes->type == StartEndTag)
                                    noframes->type = StartTag;
                            }

                            state = STATE_PARSE_NOFRAMES;
                            continue;
                        }
                    }

                    TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
                    state = STATE_PARSE_BODY;
                    continue;
                }

                /* Flag an error if we see more than one frameset. */
                if ( nodeIsFRAMESET(node) )
                {
                    if (node->type != StartTag)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if (frameset != NULL)
                        TY_(Report)(doc, html, node, DUPLICATE_FRAMESET);
                    else
                        frameset = node;

                    state = STATE_PARSE_FRAMESET;
                    continue;
                }

                /* If not a frameset document coerce <noframes> to <body>. */
                if ( nodeIsNOFRAMES(node) )
                {
                    if (node->type != StartTag)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if (frameset == NULL)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        node = TY_(InferredTag)(doc, TidyTag_BODY);
                        state = STATE_PARSE_BODY;
                        continue;
                    }

                    if (noframes == NULL)
                    {
                        noframes = node;
                        TY_(InsertNodeAtEnd)(frameset, noframes);
                        state = STATE_PARSE_NOFRAMES;
                    }
                    else
                    {
                        TY_(FreeNode)( doc, node);
                    }

                    continue;
                }

                /* Deal with some other element that we're not expecting. */
                if (TY_(nodeIsElement)(node))
                {
                    if (node->tag && node->tag->model & CM_HEAD)
                    {
                        MoveToHead(doc, html, node);
                        continue;
                    }

                    /* Discard illegal frame element following a frameset. */
                    if ( frameset != NULL && nodeIsFRAME(node) )
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)(doc, node);
                        continue;
                    }
                }

                TY_(UngetToken)( doc );

                /* Insert other content into noframes element. */
                if (frameset)
                {
                    if (noframes == NULL)
                    {
                        noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                        TY_(InsertNodeAtEnd)(frameset, noframes);
                    }
                    else
                    {
                        TY_(Report)(doc, html, node, NOFRAMES_CONTENT);
                        if (noframes->type == StartEndTag)
                            noframes->type = StartTag;
                    }

                    TY_(ConstrainVersion)(doc, VERS_FRAMESET);
                    state = STATE_PARSE_NOFRAMES;
                    continue;
                }

                node = TY_(InferredTag)(doc, TidyTag_BODY);

                /* Issue #132 - disable inserting BODY tag warning
                 BUT only if NOT --show-body-only yes */
                if (!showingBodyOnly(doc))
                    TY_(Report)(doc, html, node, INSERTING_TAG );

                TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
                state = STATE_PARSE_BODY;
                continue;
            } break;


            /**************************************************************
             In this case, we're ready to parse the head, and move on to
             look for the body or body alternative.
             **************************************************************/
            case STATE_PARSE_HEAD:
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHTML);
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = node;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_PARSE_HEAD_REENTER;
                TY_(InsertNodeAtEnd)(html, node);
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;

            case STATE_PARSE_HEAD_REENTER:
            {
                head = node;
                state = STATE_PRE_BODY;
            } break;


            /**************************************************************
             In this case, we can finally parse a body.
             **************************************************************/
            case STATE_PARSE_BODY:
            {
                TidyParserMemory memory = {0};
                memory.identity = NULL; /* we don't need to reenter */
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = NULL;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_COMPLETE;
                TY_(InsertNodeAtEnd)(html, node);
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;


            /**************************************************************
             In this case, we will parse noframes. If necessary, the
             node is already inserted in the proper spot.
             **************************************************************/
            case STATE_PARSE_NOFRAMES:
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHTML);
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = frameset;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_PARSE_NOFRAMES_REENTER;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return noframes;
            } break;

            case STATE_PARSE_NOFRAMES_REENTER:
            {
                frameset = node;
                state = STATE_PRE_BODY;
            } break;


            /**************************************************************
             In this case, we parse the frameset, and look for noframes
             content to merge later if necessary.
             **************************************************************/
            case STATE_PARSE_FRAMESET:
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHTML);
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = frameset;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_PARSE_FRAMESET_REENTER;
                TY_(InsertNodeAtEnd)(html, node);
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;

            case (STATE_PARSE_FRAMESET_REENTER):
            {
                frameset = node;
                /*
                 See if it includes a noframes element so that
                 we can merge subsequent noframes elements.
                 */
                for (node = frameset->content; node; node = node->next)
                {
                    if ( nodeIsNOFRAMES(node) )
                        noframes = node;
                }
                state = STATE_PRE_BODY;
            } break;


            /**************************************************************
             We really shouldn't get here, but if we do, finish nicely.
             **************************************************************/
            default:
            {
                state = STATE_COMPLETE;
            }
        } /* switch */
    } /* while */

    DEBUG_LOG_EXIT;
    return NULL;
}